

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strlib.cpp
# Opt level: O2

string * trim(string *__return_storage_ptr__,string *str)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  uVar3 = str->_M_string_length & 0xffffffff;
  lVar4 = str->_M_string_length << 0x20;
  do {
    lVar2 = lVar4;
    uVar3 = uVar3 - 1;
    if ((int)(uint)uVar3 < 0) break;
    iVar1 = isspace((int)(str->_M_dataplus)._M_p[(uint)uVar3 & 0x7fffffff]);
    lVar4 = lVar2 + -0x100000000;
  } while (iVar1 != 0);
  for (lVar4 = 0; lVar4 <= lVar2 + -0x100000000 >> 0x20; lVar4 = lVar4 + 1) {
    iVar1 = isspace((int)(str->_M_dataplus)._M_p[lVar4]);
    if (iVar1 == 0) break;
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  return __return_storage_ptr__;
}

Assistant:

string trim(string str) {
   int finish = str.length() - 1;
   while (finish >= 0 && isspace(str[finish])) {
      finish--;
   }
   int start = 0;
   while (start <= finish && isspace(str[start])) {
      start++;
   }
   return str.substr(start, finish - start + 1);
}